

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

void __thiscall cmTarget::ClearDependencyInformation(cmTarget *this,cmMakefile *mf)

{
  _Head_base<0UL,_cmTargetInternals_*,_false> _Var1;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string depname;
  string local_50;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  undefined8 local_20;
  char *local_18;
  
  _Var1._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  local_30._M_str = ((_Var1._M_head_impl)->Name)._M_dataplus._M_p;
  local_30._M_len = *(size_type *)((long)&(_Var1._M_head_impl)->Name + 8);
  local_20 = 0xc;
  local_18 = "_LIB_DEPENDS";
  views._M_len = 2;
  views._M_array = &local_30;
  cmCatViews_abi_cxx11_(&local_50,views);
  cmMakefile::RemoveCacheDefinition(mf,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmTarget::ClearDependencyInformation(cmMakefile& mf) const
{
  std::string depname = cmStrCat(this->GetName(), "_LIB_DEPENDS");
  mf.RemoveCacheDefinition(depname);
}